

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::logQueueInfo(CLIntercept *this,cl_device_id device,cl_command_queue queue)

{
  mutex *__mutex;
  cl_command_queue_properties cVar1;
  int iVar2;
  cl_int cVar3;
  cl_int cVar4;
  undefined8 uVar5;
  float __x;
  float __x_00;
  float __x_01;
  float fVar6;
  float extraout_XMM0_Da;
  cl_uint queueIndex;
  cl_uint queueFamily;
  char *deviceName;
  cl_command_queue_properties props;
  undefined4 local_60;
  undefined4 local_5c;
  char *local_58;
  cl_command_queue_properties local_50;
  string local_48;
  
  __mutex = &this->m_Mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    uVar5 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar5);
  }
  logf(this,__x);
  local_58 = (char *)0x0;
  cVar3 = allocateAndGetDeviceInfoString(this,device,0x102b,&local_58);
  local_50 = 0;
  cVar4 = (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1093,8,&local_50,(size_t *)0x0);
  if (cVar4 == 0 && cVar3 == 0) {
    fVar6 = logf(this,__x_00);
    cVar1 = local_50;
    if (local_50 != 0) {
      CEnumNameMap::name_command_queue_properties_abi_cxx11_
                (&local_48,&this->m_EnumNameMap,local_50);
      fVar6 = extraout_XMM0_Da;
    }
    logf(this,fVar6);
    if ((cVar1 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2)) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  local_5c = 0;
  cVar3 = (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x418c,4,&local_5c,(size_t *)0x0);
  local_60 = 0;
  cVar4 = (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x418d,4,&local_60,(size_t *)0x0);
  if (cVar4 == 0 && cVar3 == 0) {
    fVar6 = logf(this,__x_01);
    logf(this,fVar6);
  }
  if (local_58 != (char *)0x0) {
    operator_delete__(local_58);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void CLIntercept::logQueueInfo(
    const cl_device_id device,
    const cl_command_queue queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    logf( "Queue Info for %p:\n", queue );

    char*   deviceName = NULL;
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_NAME,
        deviceName );
    cl_command_queue_properties props = 0;
    errorCode |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_PROPERTIES,
        sizeof(props),
        &props,
        NULL );
    if( errorCode == CL_SUCCESS )
    {
        logf( "    For device: %s\n", deviceName );
        logf( "    Queue properties: %s\n",
            props == 0 ?
            "(None)" :
            enumName().name_command_queue_properties(props).c_str() );
    }

    // Queue family information, may not be supported for all devices.
    cl_uint queueFamily = 0;
    cl_int errorCode_qf = dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_FAMILY_INTEL,
        sizeof(queueFamily),
        &queueFamily,
        NULL );
    cl_uint queueIndex = 0;
    errorCode_qf |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_INDEX_INTEL,
        sizeof(queueIndex),
        &queueIndex,
        NULL );
    if( errorCode_qf == CL_SUCCESS )
    {
        logf( "    Queue family: %u\n", queueFamily );
        logf( "    Queue index: %u\n", queueIndex );
    }

    delete [] deviceName;
}